

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_bit_shift(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  long in_RSI;
  long in_RDI;
  IROp op;
  TRef tsh;
  TRef tr;
  TRef in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  TVar1 = lj_opt_narrow_tobit((jit_State *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc4);
  TVar2 = lj_opt_narrow_tobit((jit_State *)CONCAT44(TVar1,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc4);
  *(ushort *)(in_RDI + 0x9c) = (ushort)(*(int *)(in_RSI + 0x10) << 8) | 0x13;
  *(short *)(in_RDI + 0x98) = (short)TVar1;
  *(short *)(in_RDI + 0x9a) = (short)TVar2;
  TVar1 = lj_opt_fold((jit_State *)CONCAT44(TVar1,TVar2));
  **(TRef **)(in_RDI + 0x80) = TVar1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_bit_shift(jit_State *J, RecordFFData *rd)
{
  TRef tr = lj_opt_narrow_tobit(J, J->base[0]);
  TRef tsh = lj_opt_narrow_tobit(J, J->base[1]);
  IROp op = (IROp)rd->data;
  if (!(op < IR_BROL ? LJ_TARGET_MASKSHIFT : LJ_TARGET_MASKROT) &&
      !tref_isk(tsh))
    tsh = emitir(IRTI(IR_BAND), tsh, lj_ir_kint(J, 31));
#ifdef LJ_TARGET_UNIFYROT
  if (op == (LJ_TARGET_UNIFYROT == 1 ? IR_BROR : IR_BROL)) {
    op = LJ_TARGET_UNIFYROT == 1 ? IR_BROL : IR_BROR;
    tsh = emitir(IRTI(IR_NEG), tsh, tsh);
  }
#endif
  J->base[0] = emitir(IRTI(op), tr, tsh);
}